

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMain.cpp
# Opt level: O0

void __thiscall MinVR::VRMain::synchronizeAndProcessEvents(VRMain *this)

{
  undefined1 uVar1;
  runtime_error *this_00;
  ulong uVar2;
  size_type sVar3;
  reference ppVVar4;
  reference ppVVar5;
  VRDataIndex *in_RDI;
  char *__s;
  int in_stack_000000c4;
  string *in_stack_000000c8;
  string *in_stack_000000d0;
  VRDataIndex *in_stack_000000d8;
  int f_1;
  int f;
  VRDataIndex frameStartEvent;
  VRDataQueue eventQueue;
  string str;
  VRDataQueue *in_stack_fffffffffffffbc8;
  VRDataIndex *in_stack_fffffffffffffbd0;
  undefined7 in_stack_fffffffffffffbe0;
  VRDataQueue *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  VRDataIndex *in_stack_fffffffffffffc28;
  VRDataQueue *in_stack_fffffffffffffc30;
  VRDataIndex *in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  int iVar6;
  undefined1 local_310 [48];
  undefined1 local_2e0 [52];
  int local_2ac;
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  undefined1 local_1b9 [185];
  undefined1 local_100 [55];
  undefined1 local_c9 [40];
  allocator<char> local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  if (*(int *)&in_RDI[7]._theIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    in_stack_fffffffffffffc30 = (VRDataQueue *)local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    in_stack_fffffffffffffc28 = (VRDataIndex *)std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write((char *)&std::cout,(long)in_stack_fffffffffffffc28);
    std::__cxx11::string::~string(local_28);
  }
  if (((ulong)in_RDI[5]._lastDatum._M_node & 1) != 0) {
    VRDataQueue::VRDataQueue((VRDataQueue *)0x1223d6);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)in_stack_fffffffffffffc08,
               (allocator<char> *)in_stack_fffffffffffffc00);
    __s = (char *)VRSystem::getTime(false);
    VRAnalogEvent::createValidDataIndex
              ((string *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               in_stack_fffffffffffffce4);
    std::__cxx11::string::~string((string *)(local_1b9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1b9);
    __a = &local_1e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
    VRDataIndex::linkNode(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
    std::__cxx11::string::~string(local_208);
    std::allocator<char>::~allocator(&local_209);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    VRDataIndex::VRDataIndex(in_stack_fffffffffffffc50,in_RDI);
    VRDataQueue::push(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    VRDataIndex::~VRDataIndex(in_stack_fffffffffffffbd0);
    for (local_2ac = 0; uVar2 = (ulong)local_2ac,
        sVar3 = std::vector<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>::size
                          ((vector<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>
                            *)&in_RDI[6]._lastDatum), uVar2 < sVar3; local_2ac = local_2ac + 1) {
      ppVVar4 = std::vector<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>::
                operator[]((vector<MinVR::VRInputDevice_*,_std::allocator<MinVR::VRInputDevice_*>_>
                            *)&in_RDI[6]._lastDatum,(long)local_2ac);
      (*(*ppVVar4)->_vptr_VRInputDevice[2])(*ppVVar4,local_100);
    }
    if (*(long *)&in_RDI[5]._linkRegister._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
      in_stack_fffffffffffffbe8 =
           *(VRDataQueue **)&in_RDI[5]._linkRegister._M_t._M_impl.super__Rb_tree_header._M_header;
      VRDataQueue::VRDataQueue((VRDataQueue *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      (*(code *)**(undefined8 **)&(in_stack_fffffffffffffbe8->_dataMap)._M_t._M_impl)
                (local_2e0,in_stack_fffffffffffffbe8,local_310);
      VRDataQueue::operator=((VRDataQueue *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      VRDataQueue::~VRDataQueue((VRDataQueue *)0x12273e);
      VRDataQueue::~VRDataQueue((VRDataQueue *)0x12274b);
    }
    while (uVar1 = VRDataQueue::notEmpty((VRDataQueue *)0x122782), (bool)uVar1) {
      for (iVar6 = 0; uVar2 = (ulong)iVar6,
          sVar3 = std::vector<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>::
                  size((vector<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_> *)
                       &in_RDI[5]._linkRegister._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_right), uVar2 < sVar3; iVar6 = iVar6 + 1) {
        ppVVar5 = std::vector<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>::
                  operator[]((vector<MinVR::VREventHandler_*,_std::allocator<MinVR::VREventHandler_*>_>
                              *)&in_RDI[5]._linkRegister._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_right,(long)iVar6);
        in_stack_fffffffffffffbd0 = (VRDataIndex *)*ppVVar5;
        VRDataQueue::getFirst(in_stack_fffffffffffffbe8);
        (***(_func_int ***)&(in_stack_fffffffffffffbd0->_theIndex)._M_t._M_impl)
                  (in_stack_fffffffffffffbd0,&stack0xfffffffffffffc50);
        VRDataIndex::~VRDataIndex(in_stack_fffffffffffffbd0);
      }
      VRDataQueue::pop((VRDataQueue *)CONCAT17(uVar1,in_stack_fffffffffffffbe0));
    }
    VRDataIndex::~VRDataIndex(in_stack_fffffffffffffbd0);
    VRDataQueue::~VRDataQueue((VRDataQueue *)0x122898);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"VRMain not initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
VRMain::synchronizeAndProcessEvents() {

  if (_frame == 0) {
    VRLOG_H1("RUNNING MINVR MAINLOOP");
  }

	if (!_initialized) {
		throw std::runtime_error("VRMain not initialized.");
	}

  VRDataQueue eventQueue;

  // Add a standard "FrameStart" event at the beginning of each frame
  VRDataIndex frameStartEvent =
      VRAnalogEvent::createValidDataIndex("FrameStart", (float)VRSystem::getTime());
  // by default the data will be placed in a field called "AnalogValue".  The
  // next line is not strictly necessary, but it demonstrates how to add an
  // entry to the index with a more descriptive name for event's data payload
  // additional entries could also be added here, for example, might be useful
  // to include delta time since last frame and even the current framerate.
  // Adding more fields is fine as long as the VRSystem::getTime() remains the
  // default data stored in the AnalogValue field.
  frameStartEvent.linkNode("AnalogValue", "ElapsedSeconds");
  eventQueue.push(frameStartEvent);

  for (int f = 0; f < _inputDevices.size(); f++) {
    _inputDevices[f]->appendNewInputEventsSinceLastCall(&eventQueue);
  }

	// SYNCHRONIZATION POINT #1: When this function returns, we know
	// that all MinVR nodes have the same list of input events generated
	// since the last call to synchronizeAndProcessEvents(..).  So,
	// every node will process the same set of input events this frame.
  if (_net != NULL) {
    eventQueue = _net->syncEventDataAcrossAllNodes(eventQueue);
  }

  while (eventQueue.notEmpty()) {
    // Unpack the next item from the queue and invoke the user's
    // callback on it.
    for (int f = 0; f < _eventHandlers.size(); f++) {
      _eventHandlers[f]->onVREvent(eventQueue.getFirst());
    }

    // Remove the item from the queue.
    eventQueue.pop();
  }

  // At this point the eventQueue should be empty with all its events
  // distributed to the user callback.  Our job here is done and we can
  // safely get out.
}